

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall
BuildTestDepsGccWithEmptyDepfileErrorsOut::Run(BuildTestDepsGccWithEmptyDepfileErrorsOut *this)

{
  Builder *this_00;
  int iVar1;
  Test *pTVar2;
  bool bVar3;
  Node *pNVar4;
  string err;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  iVar1 = g_current_test->assertion_failures_;
  AssertParse(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_,
              "rule cc\n  command = cc\n  deps = gcc\nbuild out: cc\n",(ManifestParserOptions)0x0);
  if (iVar1 != g_current_test->assertion_failures_) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"out",(allocator<char> *)&local_48);
  BuildTest::Dirty(&this->super_BuildTest,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  pTVar2 = g_current_test;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"out",&local_69);
  this_00 = &(this->super_BuildTest).builder_;
  pNVar4 = Builder::AddTarget(this_00,&local_48,&local_68);
  testing::Test::Check
            (pTVar2,pNVar4 != (Node *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
             ,0x719,"builder_.AddTarget(\"out\", &err)");
  std::__cxx11::string::~string((string *)&local_48);
  pTVar2 = g_current_test;
  bVar3 = std::operator==("",&local_68);
  bVar3 = testing::Test::Check
                    (pTVar2,bVar3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                     ,0x71a,"\"\" == err");
  pTVar2 = g_current_test;
  if (bVar3) {
    bVar3 = Builder::AlreadyUpToDate(this_00);
    testing::Test::Check
              (pTVar2,!bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
               ,0x71b,"builder_.AlreadyUpToDate()");
    pTVar2 = g_current_test;
    bVar3 = Builder::Build(this_00,&local_68);
    testing::Test::Check
              (pTVar2,!bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
               ,0x71d,"builder_.Build(&err)");
    pTVar2 = g_current_test;
    bVar3 = std::operator==("subcommand failed",&local_68);
    bVar3 = testing::Test::Check
                      (pTVar2,bVar3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                       ,0x71e,"\"subcommand failed\" == err");
    if ((bVar3) &&
       (bVar3 = testing::Test::Check
                          (g_current_test,
                           (long)(this->super_BuildTest).command_runner_.commands_ran_.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->super_BuildTest).command_runner_.commands_ran_.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start == 0x20,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                           ,0x71f,"1u == command_runner_.commands_ran_.size()"), bVar3))
    goto LAB_001295eb;
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_001295eb:
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

TEST_F(BuildTest, DepsGccWithEmptyDepfileErrorsOut) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule cc\n"
"  command = cc\n"
"  deps = gcc\n"
"build out: cc\n"));
  Dirty("out");

  string err;
  EXPECT_TRUE(builder_.AddTarget("out", &err));
  ASSERT_EQ("", err);
  EXPECT_FALSE(builder_.AlreadyUpToDate());

  EXPECT_FALSE(builder_.Build(&err));
  ASSERT_EQ("subcommand failed", err);
  ASSERT_EQ(1u, command_runner_.commands_ran_.size());
}